

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

GeluLayerParams * __thiscall
CoreML::Specification::GeluLayerParams::New(GeluLayerParams *this,Arena *arena)

{
  GeluLayerParams *this_00;
  GeluLayerParams *n;
  Arena *arena_local;
  GeluLayerParams *this_local;
  
  this_00 = (GeluLayerParams *)operator_new(0x18);
  GeluLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GeluLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

GeluLayerParams* GeluLayerParams::New(::google::protobuf::Arena* arena) const {
  GeluLayerParams* n = new GeluLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}